

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O2

void * __thiscall nuraft::buffer_serializer::get_bytes(buffer_serializer *this,size_t *len)

{
  bool bVar1;
  uint32_t uVar2;
  void *pvVar3;
  overflow_error *this_00;
  
  uVar2 = get_u32(this);
  *len = (ulong)uVar2;
  bVar1 = is_valid(this,(ulong)uVar2);
  if (bVar1) {
    pvVar3 = get_raw(this,*len);
    return pvVar3;
  }
  this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
  std::overflow_error::overflow_error(this_00,"not enough space");
  __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
}

Assistant:

void* buffer_serializer::get_bytes(size_t& len) {
    len = get_u32();
    if ( !is_valid(len) ) throw std::overflow_error("not enough space");
    return get_raw(len);
}